

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O3

Error __thiscall asmjit::v1_14::BaseBuilder::registerLabelNode(BaseBuilder *this,LabelNode *node)

{
  uint uVar1;
  Error EVar2;
  LabelEntry *in_RAX;
  undefined8 *puVar3;
  uint n;
  undefined1 extraout_DL;
  LabelNode *allocator;
  CodeHolder *this_00;
  CodeHolder *unaff_R15;
  LabelEntry *le;
  size_t sStack_50;
  LabelNode *pLStack_48;
  BaseBuilder *pBStack_40;
  CodeHolder *pCStack_38;
  LabelEntry *local_28;
  
  allocator = (LabelNode *)&local_28;
  this_00 = (this->super_BaseEmitter)._code;
  if (this_00 == (CodeHolder *)0x0) {
    return 5;
  }
  local_28 = in_RAX;
  EVar2 = CodeHolder::newLabelEntry(this_00,&local_28);
  if (EVar2 != 0) {
    return EVar2;
  }
  uVar1 = *(uint *)&local_28->field_0xc;
  n = uVar1 + 1;
  if (*(uint *)&this->field_0x190 < n) {
    unaff_R15 = (CodeHolder *)&this->_labelNodes;
    allocator = (LabelNode *)&this->_allocator;
    this_00 = unaff_R15;
    EVar2 = ZoneVectorBase::_resize((ZoneVectorBase *)unaff_R15,(ZoneAllocator *)allocator,8,n);
    if (EVar2 != 0) {
      return EVar2;
    }
    if (uVar1 < *(uint *)&this->field_0x190) {
      *(LabelNode **)
       (*(long *)&((ZoneVector<asmjit::v1_14::LabelNode_*> *)unaff_R15)->field_0x0 +
       (ulong)uVar1 * 8) = node;
      *(uint *)(node + 0x30) = uVar1;
      return 0;
    }
  }
  else {
    registerLabelNode();
  }
  registerLabelNode();
  *(undefined8 *)allocator = 0;
  pLStack_48 = node;
  pBStack_40 = this;
  pCStack_38 = unaff_R15;
  if (*(long *)&this_00->_relocations == 0) {
    newAlignNode();
  }
  else {
    puVar3 = (undefined8 *)
             ZoneAllocator::_alloc((ZoneAllocator *)&this_00->_relocations,0x38,&sStack_50);
    node = allocator;
    unaff_R15 = this_00;
    if (puVar3 != (undefined8 *)0x0) {
      *puVar3 = 0;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 4;
      *(byte *)((long)puVar3 + 0x11) = this_00[1].field_0x58 | 0x11;
      *(undefined8 *)((long)puVar3 + 0x12) = 0;
      *(undefined8 *)((long)puVar3 + 0x1a) = 0;
      puVar3[4] = 0;
      puVar3[5] = 0;
      *(undefined1 *)((long)puVar3 + 0x12) = extraout_DL;
      *(uint *)(puVar3 + 6) = n;
      *(undefined8 **)allocator = puVar3;
      return 0;
    }
  }
  *(undefined8 *)node = 0;
  EVar2 = BaseEmitter::reportError((BaseEmitter *)unaff_R15,1,(char *)0x0);
  return EVar2;
}

Assistant:

Error BaseBuilder::registerLabelNode(LabelNode* node) {
  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  LabelEntry* le;
  ASMJIT_PROPAGATE(_code->newLabelEntry(&le));
  uint32_t labelId = le->id();

  // We just added one label so it must be true.
  ASMJIT_ASSERT(_labelNodes.size() < labelId + 1);
  ASMJIT_PROPAGATE(_labelNodes.resize(&_allocator, labelId + 1));

  _labelNodes[labelId] = node;
  node->_labelId = labelId;

  return kErrorOk;
}